

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::queryPipelineState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLuint pipeline,
               GLenum pname,QueriedState *state)

{
  bool bVar1;
  int *piVar2;
  QueriedState local_68;
  undefined1 local_3c [8];
  StateQueryMemoryWriteGuard<int> value;
  QueriedState *state_local;
  GLenum pname_local;
  GLuint pipeline_local;
  QueryType type_local;
  CallLogWrapper *gl_local;
  ResultCollector *result_local;
  
  if (type == QUERY_PIPELINE_INTEGER) {
    value._4_8_ = state;
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_3c);
    piVar2 = StateQueryMemoryWriteGuard<int>::operator&((StateQueryMemoryWriteGuard<int> *)local_3c)
    ;
    glu::CallLogWrapper::glGetProgramPipelineiv(gl,pipeline,pname,piVar2);
    bVar1 = checkError(result,gl,"glGetProgramiv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int> *)local_3c,result), bVar1)) {
      piVar2 = StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_3c);
      QueriedState::QueriedState(&local_68,*piVar2);
      memcpy((void *)value._4_8_,&local_68,0x28);
    }
  }
  return;
}

Assistant:

void queryPipelineState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLuint pipeline, glw::GLenum pname, QueriedState& state)
{
	switch (type)
	{
		case QUERY_PIPELINE_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetProgramPipelineiv(pipeline, pname, &value);

			if (!checkError(result, gl, "glGetProgramiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}